

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcGeometryShaderAdjacencyTests.cpp
# Opt level: O3

void __thiscall
glcts::GeometryShaderAdjacencyTests::createGridLineStrip
          (GeometryShaderAdjacencyTests *this,AdjacencyTestData *test_data)

{
  uint uVar1;
  GLuint GVar2;
  AdjacencyGrid *pAVar3;
  AdjacencyGridPoint *__s;
  long lVar4;
  ulong uVar5;
  AdjacencyGridPoint **ppAVar6;
  GLfloat *pGVar7;
  
  pAVar3 = test_data->m_grid;
  GVar2 = pAVar3->m_n_points;
  uVar1 = GVar2 + 2;
  (pAVar3->m_line_strip).m_n_points = uVar1;
  uVar5 = (ulong)uVar1 * 0xc;
  __s = (AdjacencyGridPoint *)operator_new__(uVar5);
  (pAVar3->m_line_strip).m_points = __s;
  memset(__s,0,uVar5);
  if (uVar1 != 0) {
    pGVar7 = &__s->x;
    lVar4 = -0x10;
    uVar5 = 0;
    do {
      ((AdjacencyGridPoint *)(pGVar7 + -1))->index = (GLuint)uVar5;
      if (uVar5 == 0) {
        ppAVar6 = &pAVar3->m_line_segments->m_point_start_adjacent;
      }
      else if (GVar2 + 1 == uVar5) {
        ppAVar6 = &pAVar3->m_line_segments[pAVar3->m_n_segments - 1].m_point_end_adjacent;
      }
      else {
        ppAVar6 = (AdjacencyGridPoint **)((long)&pAVar3->m_line_segments->m_point_end + lVar4);
      }
      *(undefined8 *)pGVar7 = *(undefined8 *)&(*ppAVar6)->x;
      uVar5 = uVar5 + 1;
      pGVar7 = pGVar7 + 3;
      lVar4 = lVar4 + 0x20;
    } while (uVar1 != uVar5);
  }
  return;
}

Assistant:

void GeometryShaderAdjacencyTests::createGridLineStrip(AdjacencyTestData& test_data)
{
	/* Add 2 extra point for adjacency start+end points */
	test_data.m_grid->m_line_strip.m_n_points = test_data.m_grid->m_n_points + 2;
	test_data.m_grid->m_line_strip.m_points   = new AdjacencyGridPoint[test_data.m_grid->m_line_strip.m_n_points];

	memset(test_data.m_grid->m_line_strip.m_points, 0,
		   sizeof(AdjacencyGridPoint) * test_data.m_grid->m_line_strip.m_n_points);

	for (unsigned int n = 0; n < test_data.m_grid->m_line_strip.m_n_points; ++n)
	{
		AdjacencyGridPoint* pointPtr = test_data.m_grid->m_line_strip.m_points + n;

		pointPtr->index = n;

		/* If this is a start point, use any of the adjacent points */
		if (n == 0)
		{
			pointPtr->x = test_data.m_grid->m_line_segments[0].m_point_start_adjacent->x;
			pointPtr->y = test_data.m_grid->m_line_segments[0].m_point_start_adjacent->y;
		}
		else
			/* Last point should be handled analogously */
			if (n == (test_data.m_grid->m_line_strip.m_n_points - 1))
		{
			pointPtr->x = test_data.m_grid->m_line_segments[test_data.m_grid->m_n_segments - 1].m_point_end_adjacent->x;
			pointPtr->y = test_data.m_grid->m_line_segments[test_data.m_grid->m_n_segments - 1].m_point_end_adjacent->y;
		}
		else
		/* Intermediate points */
		{
			pointPtr->x = test_data.m_grid->m_line_segments[n - 1].m_point_start->x;
			pointPtr->y = test_data.m_grid->m_line_segments[n - 1].m_point_start->y;
		}
	} /* for (all points) */
}